

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  uint channelsOut;
  ma_uint32 channelsIn;
  ma_attenuation_model mVar1;
  ma_handedness mVar2;
  ma_channel *pChannelMapOut;
  byte bVar3;
  float *pfVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  int iVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float in_XMM1_Db;
  undefined4 uVar20;
  undefined1 auVar19 [16];
  float monoExpansionMode;
  undefined1 auVar21 [16];
  float fVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  int iVar26;
  float fVar27;
  ma_vec3f mVar28;
  ma_vec3f mVar29;
  ma_channel_mix_mode in_stack_fffffffffffffeb0;
  ma_mono_expansion_mode in_stack_fffffffffffffeb8;
  float fStack_144;
  ma_vec3f local_108;
  undefined8 local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ma_channel *local_e8;
  float *local_e0;
  float local_d4;
  float local_d0;
  ma_uint32 local_cc;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  ma_vec3f local_b8;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined1 local_48 [16];
  
  uVar20 = 0;
  local_e8 = pSpatializer->pChannelMapIn;
  pChannelMapOut = (pListener->config).pChannelMapOut;
  if (pSpatializer->attenuationModel == ma_attenuation_model_none) {
    if (pListener->isEnabled == 0) {
      if ((pFramesOut != (void *)0x0) &&
         (sVar6 = (pSpatializer->channelsOut << 2) * frameCount, sVar6 != 0)) {
        memset(pFramesOut,0,sVar6);
      }
    }
    else {
      channelsIn = pSpatializer->channelsIn;
      if (channelsIn == pSpatializer->channelsOut) {
        if (pFramesOut != pFramesIn) {
          memcpy(pFramesOut,pFramesIn,(channelsIn << 2) * frameCount);
        }
      }
      else {
        ma_channel_map_apply_f32
                  ((float *)pFramesOut,pChannelMapOut,pSpatializer->channelsOut,(float *)pFramesIn,
                   local_e8,channelsIn,frameCount,in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffeb8);
      }
    }
    pSpatializer->dopplerPitch = 1.0;
    return MA_SUCCESS;
  }
  local_cc = pSpatializer->channelsIn;
  channelsOut = pSpatializer->channelsOut;
  uVar7 = (ulong)channelsOut;
  fVar18 = pSpatializer->minDistance;
  local_c8 = CONCAT44(local_c8._4_4_,pSpatializer->maxDistance);
  fVar9 = pSpatializer->rolloff;
  local_78 = ZEXT416((uint)pSpatializer->dopplerFactor);
  local_e0 = (float *)pFramesIn;
  mVar28 = ma_atomic_vec3f_get(&pListener->velocity);
  local_58 = mVar28.z;
  local_68 = mVar28._0_8_;
  local_48 = ZEXT416((uint)(pListener->config).speedOfSound);
  local_f8 = pListener;
  uStack_60 = extraout_XMM0_Qb;
  fStack_54 = in_XMM1_Db;
  uStack_50 = uVar20;
  if (pSpatializer->positioning == ma_positioning_relative) {
    local_108 = ma_atomic_vec3f_get(&pSpatializer->position);
    uVar11 = local_108._0_8_;
    local_88._0_4_ = local_108.z;
    local_b8 = ma_atomic_vec3f_get(&pSpatializer->direction);
    fVar27 = (float)local_88._0_4_;
  }
  else {
    ma_spatializer_get_relative_position_and_direction(pSpatializer,pListener,&local_108,&local_b8);
    pListener = local_f8;
    fVar27 = local_108.z;
    uVar11 = local_108._0_8_;
  }
  monoExpansionMode =
       SQRT(fVar27 * fVar27 + (float)uVar11 * (float)uVar11 + SUB84(uVar11,4) * SUB84(uVar11,4));
  mVar1 = pSpatializer->attenuationModel;
  fVar27 = 1.0;
  if (mVar1 == ma_attenuation_model_exponential) {
    if (fVar18 < (float)local_c8) {
      fVar27 = monoExpansionMode;
      if ((float)local_c8 <= monoExpansionMode) {
        fVar27 = (float)local_c8;
      }
      fVar17 = fVar18;
      if (fVar18 <= fVar27) {
        fVar17 = fVar27;
      }
      dVar12 = pow((double)(fVar17 / fVar18),(double)-fVar9);
      fVar27 = (float)dVar12;
    }
  }
  else if (mVar1 == ma_attenuation_model_linear) {
    if (fVar18 < (float)local_c8) {
      fVar27 = monoExpansionMode;
      if ((float)local_c8 <= monoExpansionMode) {
        fVar27 = (float)local_c8;
      }
      fVar17 = fVar18;
      if (fVar18 <= fVar27) {
        fVar17 = fVar27;
      }
      fVar27 = 1.0 - ((fVar17 - fVar18) * fVar9) / ((float)local_c8 - fVar18);
    }
  }
  else if ((mVar1 == ma_attenuation_model_inverse) && (fVar18 < (float)local_c8)) {
    fVar27 = monoExpansionMode;
    if ((float)local_c8 <= monoExpansionMode) {
      fVar27 = (float)local_c8;
    }
    fVar17 = fVar18;
    if (fVar18 <= fVar27) {
      fVar17 = fVar27;
    }
    fVar27 = fVar18 / (fVar9 * (fVar17 - fVar18) + fVar18);
  }
  if (monoExpansionMode <= 0.001) {
    fVar18 = 0.0;
  }
  else {
    fVar9 = 1.0 / monoExpansionMode;
    fVar22 = local_108.z * fVar9;
    fStack_c0 = local_108.y;
    fVar17 = fVar9 * local_108.x;
    local_88 = ZEXT416((uint)fVar17);
    fVar18 = pSpatializer->coneOuterGain;
    local_c8 = CONCAT44(fStack_c0,fStack_c0 * fVar9);
    fStack_bc = fStack_c0;
    fVar9 = 1.0;
    if (pSpatializer->coneInnerAngleInRadians < 6.283185) {
      local_98 = -fVar17;
      uStack_94 = 0x80000000;
      uStack_90 = 0x80000000;
      uStack_8c = 0x80000000;
      local_a8 = local_b8.x;
      fStack_a4 = local_b8.y;
      uStack_a0 = 0;
      fVar17 = local_b8.z * fVar22;
      local_d4 = pSpatializer->coneOuterAngleInRadians;
      dVar12 = sin(1.5707963267948966 - (double)(pSpatializer->coneInnerAngleInRadians * 0.5));
      local_d0 = (float)dVar12;
      dVar12 = sin(1.5707963267948966 - (double)(local_d4 * 0.5));
      fVar17 = (local_98 * local_a8 - fStack_a4 * (float)local_c8) - fVar17;
      fVar9 = 1.0;
      if ((fVar17 <= local_d0) && (fVar10 = (float)dVar12, fVar9 = fVar18, fVar10 < fVar17)) {
        fVar9 = (fVar17 - fVar10) / (local_d0 - fVar10);
        fVar9 = fVar18 * (1.0 - fVar9) + fVar9;
      }
    }
    fVar27 = fVar27 * fVar9;
    fVar9 = (pListener->config).coneInnerAngleInRadians;
    fVar18 = monoExpansionMode;
    if (fVar9 < 6.283185) {
      mVar2 = (pListener->config).handedness;
      fVar17 = (pListener->config).coneOuterGain;
      local_a8 = (pListener->config).coneOuterAngleInRadians * 0.5;
      dVar12 = sin(1.5707963267948966 - (double)(fVar9 * 0.5));
      local_98 = (float)dVar12;
      dVar12 = sin(1.5707963267948966 - (double)local_a8);
      fVar9 = fVar22 * *(float *)(&DAT_001999f0 + (ulong)(mVar2 == ma_handedness_right) * 4) +
              (float)local_88._0_4_ * 0.0 + (float)local_c8 * 0.0;
      if (fVar9 <= local_98) {
        fVar22 = (float)dVar12;
        if (fVar22 < fVar9) {
          fVar9 = (fVar9 - fVar22) / (local_98 - fVar22);
          fVar17 = fVar17 * (1.0 - fVar9) + fVar9;
        }
      }
      else {
        fVar17 = 1.0;
      }
      fVar27 = fVar27 * fVar17;
      pListener = local_f8;
    }
  }
  auVar14 = _DAT_0019e5b0;
  auVar15 = _DAT_001990c0;
  pfVar4 = &pSpatializer->maxGain;
  fVar9 = fVar27;
  if (pSpatializer->maxGain <= fVar27) {
    fVar9 = *pfVar4;
  }
  if (pSpatializer->minGain <= fVar9) {
    if (fVar27 < *pfVar4) goto LAB_0015e9b4;
  }
  else {
    pfVar4 = &pSpatializer->minGain;
  }
  fVar27 = *pfVar4;
LAB_0015e9b4:
  if (uVar7 != 0) {
    pfVar4 = pSpatializer->pNewChannelGainsOut;
    lVar8 = uVar7 - 1;
    auVar13._8_4_ = (int)lVar8;
    auVar13._0_8_ = lVar8;
    auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar5 = 0;
    auVar13 = auVar13 ^ _DAT_001990c0;
    auVar19 = _DAT_001990e0;
    auVar21 = _DAT_001990b0;
    do {
      auVar25 = auVar21 ^ auVar15;
      iVar16 = auVar13._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar16 && auVar13._0_4_ < auVar25._0_4_ ||
                  iVar16 < auVar25._4_4_) & 1)) {
        *(float *)((long)pfVar4 + uVar5) = fVar27;
      }
      if ((auVar25._12_4_ != auVar13._12_4_ || auVar25._8_4_ <= auVar13._8_4_) &&
          auVar25._12_4_ <= auVar13._12_4_) {
        *(float *)((long)pfVar4 + uVar5 + 4) = fVar27;
      }
      auVar25 = auVar19 ^ auVar15;
      iVar26 = auVar25._4_4_;
      if (iVar26 <= iVar16 && (iVar26 != iVar16 || auVar25._0_4_ <= auVar13._0_4_)) {
        *(float *)((long)pfVar4 + uVar5 + 8) = fVar27;
        *(float *)((long)pfVar4 + uVar5 + 0xc) = fVar27;
      }
      lVar8 = auVar21._8_8_;
      lVar23 = auVar14._0_8_;
      auVar21._0_8_ = auVar21._0_8_ + lVar23;
      lVar24 = auVar14._8_8_;
      auVar21._8_8_ = lVar8 + lVar24;
      lVar8 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + lVar23;
      auVar19._8_8_ = lVar8 + lVar24;
      uVar5 = uVar5 + 0x10;
    } while ((uVar7 * 4 + 0xc & 0xfffffffffffffff0) != uVar5);
  }
  if (pListener->isEnabled == 0) {
    if ((pFramesOut != (void *)0x0) &&
       (sVar6 = (pSpatializer->channelsOut << 2) * frameCount, sVar6 != 0)) {
      memset(pFramesOut,0,sVar6);
    }
  }
  else {
    ma_channel_map_apply_f32
              ((float *)pFramesOut,pChannelMapOut,channelsOut,local_e0,local_e8,local_cc,frameCount,
               in_stack_fffffffffffffeb0,(ma_mono_expansion_mode)monoExpansionMode);
  }
  local_c8 = frameCount;
  if ((0.001 < monoExpansionMode) && (uVar7 != 0)) {
    fVar18 = 1.0 / fVar18;
    local_e8 = (ma_channel *)CONCAT44(local_e8._4_4_,fVar18 * local_108.x);
    fVar9 = local_108.y;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,fVar18 * local_108.z);
    uVar5 = 0;
    do {
      if (pChannelMapOut == (ma_channel *)0x0) {
        bVar3 = ma_channel_map_init_standard_channel
                          (ma_standard_channel_map_default,channelsOut,(ma_uint32)uVar5);
      }
      else {
        bVar3 = pChannelMapOut[uVar5];
      }
      fVar27 = 1.0;
      if (((5 < bVar3) || ((0x23U >> (bVar3 & 0x1f) & 1) == 0)) && (0x1f < (byte)(bVar3 - 0x14))) {
        lVar8 = 0;
        do {
          if ((g_maChannelPlaneRatios[bVar3][lVar8] != 0.0) ||
             (NAN(g_maChannelPlaneRatios[bVar3][lVar8]))) {
            uVar11 = 0;
            fVar27 = -1.0;
            if (bVar3 < 0x34) {
              uVar11._0_4_ = g_maChannelDirections[bVar3].x;
              uVar11._4_4_ = g_maChannelDirections[bVar3].y;
              fVar27 = g_maChannelDirections[bVar3].z;
            }
            fVar27 = (((float)((ulong)uVar11 >> 0x20) * fVar9 * fVar18 +
                       local_e8._0_4_ * (float)uVar11 + fVar27 * local_e0._0_4_ + -1.0) *
                      pSpatializer->directionalAttenuationFactor + 1.0 + 1.0) * 0.5;
            break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
      }
      if (fVar27 <= pSpatializer->minSpatializationChannelGain) {
        fVar27 = pSpatializer->minSpatializationChannelGain;
      }
      pSpatializer->pNewChannelGainsOut[uVar5] = fVar27 * pSpatializer->pNewChannelGainsOut[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar7);
  }
  ma_gainer_set_gains(&pSpatializer->gainer,pSpatializer->pNewChannelGainsOut);
  ma_gainer_process_pcm_frames(&pSpatializer->gainer,pFramesOut,pFramesOut,local_c8);
  fVar9 = 1.0;
  fVar18 = 0.0;
  uStack_ec = 0;
  if (0.0 < (float)local_78._0_4_) {
    mVar28 = ma_atomic_vec3f_get(&local_f8->position);
    local_f8._0_4_ = mVar28.z;
    uStack_f0 = 0;
    local_f8._4_4_ = fVar18;
    mVar29 = ma_atomic_vec3f_get(&pSpatializer->position);
    fStack_144 = mVar28.y;
    fVar27 = mVar28.x - mVar29.x;
    fStack_144 = fStack_144 - mVar29.y;
    local_f8 = (ma_spatializer_listener *)CONCAT44(local_f8._4_4_,(float)local_f8 - mVar29.z);
    mVar28 = ma_atomic_vec3f_get(&pSpatializer->velocity);
    fVar9 = 1.0;
    auVar15._0_4_ =
         SQRT((float)local_f8 * (float)local_f8 + fVar27 * fVar27 + fStack_144 * fStack_144);
    if ((auVar15._0_4_ != 0.0) || (NAN(auVar15._0_4_))) {
      auVar25._0_4_ = (float)local_48._0_4_ / (float)local_78._0_4_;
      auVar14._0_4_ =
           local_58 * (float)local_f8 + (float)local_68 * fVar27 + local_68._4_4_ * fStack_144;
      auVar14._4_4_ = mVar28.z * (float)local_f8 + mVar28.x * fVar27 + mVar28.y * fStack_144;
      auVar14._8_4_ =
           fStack_54 * (float)local_f8 + local_68._4_4_ * fVar27 + (float)uStack_60 * fStack_144;
      auVar14._12_4_ = fVar18 * (float)local_f8 + mVar28.y * fVar27 + uStack_60._4_4_ * fStack_144;
      auVar15._4_4_ = auVar15._0_4_;
      auVar15._8_4_ = auVar15._0_4_;
      auVar15._12_4_ = auVar15._0_4_;
      auVar15 = divps(auVar14,auVar15);
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = auVar25._0_4_;
      auVar25._12_4_ = auVar25._0_4_;
      auVar15 = minps(auVar15,auVar25);
      fVar9 = ((float)local_48._0_4_ - (float)local_78._0_4_ * auVar15._0_4_) /
              ((float)local_48._0_4_ - (float)local_78._0_4_ * auVar15._4_4_);
    }
  }
  pSpatializer->dopplerPitch = fVar9;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (ma_atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The velocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = ma_spatializer_listener_get_velocity(pListener);
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = ma_spatializer_get_position(pSpatializer);
            relativeDir = ma_spatializer_get_direction(pSpatializer);
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source angular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        The gain needs to be applied per-channel here. The spatialization code below will be changing the per-channel
        gains which will then eventually be passed into the gainer which will deal with smoothing the gain transitions
        to avoid harsh changes in gain.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }


        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = pSpatializer->minSpatializationChannelGain;

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(ma_spatializer_listener_get_position(pListener), ma_spatializer_get_position(pSpatializer)), ma_spatializer_get_velocity(pSpatializer), listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}